

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O2

void __thiscall rcdiscover::SocketLinux::enableBroadcastImpl(SocketLinux *this)

{
  int iVar1;
  SocketException *this_00;
  int *piVar2;
  allocator<char> local_3d;
  int yes;
  string local_38;
  
  yes = 1;
  iVar1 = setsockopt(this->sock_,1,6,&yes,4);
  if (iVar1 != -1) {
    return;
  }
  this_00 = (SocketException *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Error while setting socket options",&local_3d);
  piVar2 = __errno_location();
  SocketException::SocketException(this_00,&local_38,*piVar2);
  __cxa_throw(this_00,&SocketException::typeinfo,SocketException::~SocketException);
}

Assistant:

void SocketLinux::enableBroadcastImpl()
{
  const int yes = 1;
  if (::setsockopt(sock_,
                  SOL_SOCKET,
                  SO_BROADCAST,
                  reinterpret_cast<const char *>(&yes),
                  sizeof(yes)) == -1)
  {
    throw SocketException("Error while setting socket options", errno);
  }
}